

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::getVarTypeSize(anon_unknown_0 *this,VarType *type)

{
  anon_unknown_0 *paVar1;
  long lVar2;
  int iVar3;
  DataType DVar4;
  int size;
  int iVar5;
  long lVar6;
  int ndx;
  long lVar7;
  int iVar8;
  
  iVar8 = 1;
  while( true ) {
    iVar5 = *(int *)this;
    if (iVar5 != 1) break;
    paVar1 = this + 0x10;
    this = *(anon_unknown_0 **)(this + 8);
    if (*(int *)paVar1 != -1) {
      iVar8 = iVar8 * *(int *)paVar1;
    }
  }
  if (iVar5 == 0) {
    iVar5 = glu::getDataTypeScalarSize(*(DataType *)(this + 8));
    DVar4 = glu::getDataTypeScalarType(*(DataType *)(this + 8));
    iVar5 = (uint)((DVar4 == TYPE_BOOL || DVar4 == TYPE_FLOAT) ||
                  (DVar4 & ~TYPE_FLOAT_VEC4) == TYPE_INT) * iVar5 * 4;
  }
  else if (iVar5 == 2) {
    lVar6 = 0x20;
    iVar5 = 0;
    for (lVar7 = 0; lVar2 = *(long *)(*(long *)(this + 8) + 0x20),
        lVar7 < (int)((*(long *)(*(long *)(this + 8) + 0x28) - lVar2) / 0x38); lVar7 = lVar7 + 1) {
      iVar3 = getVarTypeSize((anon_unknown_0 *)(lVar2 + lVar6),type);
      iVar5 = iVar5 + iVar3;
      lVar6 = lVar6 + 0x38;
    }
  }
  else {
    iVar5 = 0;
  }
  return iVar5 * iVar8;
}

Assistant:

static int getVarTypeSize (const glu::VarType& type)
{
	if (type.isBasicType())
	{
		// return in basic machine units
		return glu::getDataTypeScalarSize(type.getBasicType()) * getTypeSize(glu::getDataTypeScalarType(type.getBasicType()));
	}
	else if (type.isStructType())
	{
		int size = 0;
		for (int ndx = 0; ndx < type.getStructPtr()->getNumMembers(); ++ndx)
			size += getVarTypeSize(type.getStructPtr()->getMember(ndx).getType());
		return size;
	}
	else if (type.isArrayType())
	{
		// unsized arrays are handled as if they had only one element
		if (type.getArraySize() == glu::VarType::UNSIZED_ARRAY)
			return getVarTypeSize(type.getElementType());
		else
			return type.getArraySize() * getVarTypeSize(type.getElementType());
	}
	else
	{
		DE_ASSERT(false);
		return 0;
	}
}